

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O3

REF_STATUS
ref_fixture_pri_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_DBL *pRVar1;
  REF_GRID_conflict pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  undefined8 uVar10;
  REF_STATUS RVar11;
  REF_NODE ref_node;
  undefined4 in_register_00000084;
  char *pcVar12;
  REF_GRID_conflict pRVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  REF_INT cell;
  REF_INT pri [6];
  REF_INT node;
  uint local_138;
  uint local_134;
  uint uStack_130;
  uint uStack_12c;
  undefined4 local_128;
  undefined8 local_118;
  ulong local_110;
  double local_108;
  REF_INT local_fc;
  double local_f8;
  REF_GRID_conflict local_f0;
  REF_NODE local_e8;
  uint local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  undefined4 local_bc;
  REF_DBL local_b0;
  ulong local_a8;
  REF_DBL local_a0;
  double local_98;
  double local_90;
  ulong local_88;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  ulong local_68;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_34;
  
  local_118 = CONCAT44(in_register_00000084,n);
  uVar7 = (ulong)(uint)l;
  uVar3 = 0;
  if (0 < l0) {
    uVar3 = l0;
  }
  uVar16 = l - 1;
  if ((int)uVar16 <= (int)uVar3) {
    uVar3 = uVar16;
  }
  uVar18 = (ulong)uVar3;
  local_108 = x1;
  local_f8 = x0;
  local_e8 = (REF_NODE)y1;
  local_98 = z1;
  local_90 = y0;
  local_60 = z0;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    iVar17 = (int)local_118;
    pRVar13 = *ref_grid_ptr;
    ref_node = pRVar13->node;
    local_68 = uVar18;
    if (pRVar13->mpi->id == 0) {
      uVar3 = iVar17 - 1;
      uVar18 = (ulong)uVar3;
      uVar19 = (ulong)(uint)m;
      local_f0 = pRVar13;
      if (iVar17 < 1) {
LAB_00127ad7:
        local_d0 = (ulong)(uint)((int)uVar19 * l);
      }
      else {
        local_108 = (local_108 - local_f8) / (double)(int)uVar16;
        local_e0 = m - 1;
        local_e8 = (REF_NODE)(((double)local_e8 - local_90) / (double)(int)local_e0);
        local_98 = (local_98 - local_60) / (double)(int)uVar3;
        local_d0 = (ulong)(uint)(m * l);
        local_88 = 0;
        local_dc = 0;
        local_110 = (ulong)(uint)m;
        local_d8 = (ulong)uVar3;
        do {
          if (0 < (int)local_110) {
            local_a0 = (double)local_dc * local_98 + local_60;
            iVar17 = 0;
            uVar18 = local_88;
            do {
              if (0 < l) {
                local_b0 = (double)iVar17 * (double)local_e8 + local_90;
                uVar19 = 0;
                do {
                  uVar3 = ref_node_add(ref_node,(long)((int)uVar18 + (int)uVar19),&local_34);
                  if (uVar3 != 0) {
                    uVar18 = (ulong)uVar3;
                    pcVar12 = "node";
                    uVar10 = 0x5a6;
                    goto LAB_0012785e;
                  }
                  pRVar1 = ref_node->real;
                  lVar9 = (long)local_34;
                  pRVar1[lVar9 * 0xf] = (double)(int)uVar19 * local_108 + local_f8;
                  pRVar1[lVar9 * 0xf + 1] = local_b0;
                  pRVar1[lVar9 * 0xf + 2] = local_a0;
                  uVar19 = uVar19 + 1;
                } while (uVar7 != uVar19);
              }
              iVar17 = iVar17 + 1;
              uVar18 = uVar18 + uVar7;
            } while (iVar17 != (int)local_110);
          }
          local_dc = local_dc + 1;
          local_88 = local_88 + local_d0;
          iVar17 = (int)local_118;
        } while (local_dc != iVar17);
        uVar18 = local_d8;
        uVar19 = local_110;
        if (iVar17 == 1) goto LAB_00127ad7;
        local_70 = (int)local_110 + 1;
        local_a8 = (ulong)local_70;
        local_70 = l * local_70;
        local_6c = 1;
        local_74 = 0;
        local_78 = (uint)local_d0;
        pRVar13 = local_f0;
        uVar18 = local_110;
        local_e8 = ref_node;
        local_7c = l;
        do {
          if (1 < (int)uVar18) {
            local_dc = 1;
            local_98 = (double)(ulong)local_74;
            local_90 = (double)(ulong)local_78;
            uVar3 = local_7c;
            uVar4 = local_70;
            do {
              if (1 < l) {
                uVar15 = 0;
                local_88 = (ulong)uVar4;
                local_60 = (double)(ulong)uVar3;
                do {
                  local_58 = SUB84(local_98,0) + uVar15;
                  local_54 = SUB84(local_98,0) + uVar15 + 1;
                  iVar17 = SUB84(local_60,0);
                  local_50 = iVar17 + 1 + uVar15;
                  local_4c = SUB84(local_90,0) + uVar15;
                  local_48 = SUB84(local_90,0) + 1 + uVar15;
                  iVar14 = (int)local_88;
                  local_44 = iVar14 + 1 + uVar15;
                  local_108 = (double)CONCAT44(local_108._4_4_,local_58);
                  local_f8 = (double)CONCAT44(local_f8._4_4_,local_50);
                  local_b0 = (REF_DBL)CONCAT44(local_b0._4_4_,local_4c);
                  local_a0 = (REF_DBL)CONCAT44(local_a0._4_4_,local_44);
                  uVar3 = ref_cell_add(pRVar13->cell[10],&local_58,&local_fc);
                  if (uVar3 != 0) {
                    uVar18 = (ulong)uVar3;
                    pcVar12 = "pri";
                    uVar10 = 0x5c0;
                    goto LAB_0012785e;
                  }
                  local_44 = uVar15 + iVar14;
                  local_50 = iVar17 + uVar15;
                  local_58 = local_108._0_4_;
                  local_54 = local_f8._0_4_;
                  local_4c = local_b0._0_4_;
                  local_48 = local_a0._0_4_;
                  uVar3 = ref_cell_add(local_f0->cell[10],&local_58,&local_fc);
                  if (uVar3 != 0) {
                    uVar18 = (ulong)uVar3;
                    pcVar12 = "pri";
                    uVar10 = 0x5c7;
                    goto LAB_0012785e;
                  }
                  uVar15 = uVar15 + 1;
                  uVar3 = SUB84(local_60,0);
                  uVar4 = (uint)local_88;
                  pRVar13 = local_f0;
                } while (uVar16 != uVar15);
              }
              local_dc = local_dc + 1;
              uVar4 = uVar4 + l;
              uVar3 = uVar3 + l;
              local_90 = (double)(ulong)(uint)(SUB84(local_90,0) + l);
              local_98 = (double)(ulong)(uint)(SUB84(local_98,0) + l);
              uVar18 = local_110;
            } while (local_dc != (int)local_110);
          }
          local_6c = local_6c + 1;
          iVar17 = (int)local_d0;
          local_70 = local_70 + iVar17;
          local_7c = local_7c + iVar17;
          local_78 = local_78 + iVar17;
          local_74 = local_74 + iVar17;
        } while (local_6c != (int)local_118);
        local_128 = 1;
        if ((int)local_118 == 1) {
          iVar17 = 1;
          uVar18 = local_d8;
          ref_node = local_e8;
          uVar19 = local_110;
        }
        else {
          local_a8 = (ulong)(uint)((int)local_a8 * l);
          iVar17 = 1;
          uVar3 = 0;
          do {
            uVar15 = local_e0;
            uVar4 = uVar3;
            if (1 < (int)local_110) {
              do {
                uStack_12c = (int)local_d0 + uVar4;
                uStack_130 = (int)local_a8 + uVar4;
                local_138 = uVar4;
                local_134 = l + uVar4;
                uVar5 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_138,&local_fc);
                if (uVar5 != 0) {
                  uVar18 = (ulong)uVar5;
                  pcVar12 = "qua";
                  uVar10 = 0x5d3;
                  goto LAB_0012785e;
                }
                uVar15 = uVar15 - 1;
                uVar4 = l + uVar4;
              } while (uVar15 != 0);
            }
            iVar17 = iVar17 + 1;
            uVar3 = uVar3 + (int)local_d0;
          } while (iVar17 != (int)local_118);
          local_128 = 2;
          if ((int)local_118 == 1) {
            iVar17 = 1;
            uVar18 = local_d8;
            ref_node = local_e8;
            uVar19 = local_110;
          }
          else {
            uVar3 = ((int)local_110 + 2) * l - 1;
            local_f8 = (double)CONCAT44(local_f8._4_4_,l * 2 + -1);
            local_a8 = (ulong)((int)local_a8 - 1);
            local_a0 = (REF_DBL)CONCAT44(local_a0._4_4_,1);
            local_b0 = (REF_DBL)CONCAT44(local_b0._4_4_,uVar16);
            do {
              local_108 = (double)CONCAT44(local_108._4_4_,local_e0);
              uVar18 = local_a8;
              uVar15 = local_b0._0_4_;
              uVar5 = local_f8._0_4_;
              uVar4 = uVar3;
              if (1 < (int)local_110) {
                do {
                  local_138 = uVar5;
                  local_134 = uVar15;
                  uStack_130 = (uint)uVar18;
                  uStack_12c = uVar4;
                  uVar6 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_138,&local_fc);
                  if (uVar6 != 0) {
                    uVar18 = (ulong)uVar6;
                    pcVar12 = "qua";
                    uVar10 = 0x5df;
                    goto LAB_0012785e;
                  }
                  uVar4 = uVar4 + l;
                  uVar5 = uVar5 + l;
                  uVar18 = (ulong)((uint)uVar18 + l);
                  uVar15 = uVar15 + l;
                  iVar17 = local_108._0_4_ + -1;
                  local_108 = (double)CONCAT44(local_108._4_4_,iVar17);
                } while (iVar17 != 0);
              }
              iVar14 = local_a0._0_4_ + 1;
              iVar17 = (int)local_d0;
              uVar3 = uVar3 + iVar17;
              local_f8 = (double)CONCAT44(local_f8._4_4_,local_f8._0_4_ + iVar17);
              local_a8 = (ulong)(uint)((int)local_a8 + iVar17);
              local_b0 = (REF_DBL)CONCAT44(local_b0._4_4_,local_b0._0_4_ + iVar17);
              local_a0 = (REF_DBL)CONCAT44(local_a0._4_4_,iVar14);
            } while (iVar14 != (int)local_118);
            local_128 = 3;
            if ((int)local_118 == 1) {
              iVar17 = 1;
              uVar18 = local_d8;
              ref_node = local_e8;
              uVar19 = local_110;
            }
            else {
              uVar3 = 1;
              uVar18 = local_d0 & 0xffffffff;
              local_108 = (double)CONCAT44(local_108._4_4_,1);
              do {
                iVar17 = (int)uVar18;
                uVar4 = uVar3;
                uVar15 = uVar16;
                if (1 < l) {
                  do {
                    local_134 = uVar4 - 1;
                    uStack_130 = (uint)uVar18;
                    uStack_12c = uStack_130 + 1;
                    uVar18 = (ulong)uStack_12c;
                    local_138 = uVar4;
                    uVar5 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_138,&local_fc);
                    if (uVar5 != 0) {
                      uVar18 = (ulong)uVar5;
                      pcVar12 = "qua";
                      uVar10 = 0x5eb;
                      goto LAB_0012785e;
                    }
                    uVar4 = uVar4 + 1;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
                iVar14 = local_108._0_4_ + 1;
                uVar18 = (ulong)(uint)(iVar17 + (int)local_d0);
                uVar3 = uVar3 + (int)local_d0;
                local_108 = (double)CONCAT44(local_108._4_4_,iVar14);
              } while (iVar14 != (int)local_118);
              local_128 = 4;
              if ((int)local_118 != 1) {
                local_e0 = local_e0 * l;
                uVar3 = ((int)local_110 * 2 + -1) * l;
                iVar17 = 1;
                do {
                  uVar15 = local_e0;
                  uVar5 = uVar16;
                  uVar4 = uVar3;
                  if (1 < l) {
                    do {
                      local_138 = uVar15;
                      local_134 = uVar15 + 1;
                      uStack_130 = uVar4 + 1;
                      uStack_12c = uVar4;
                      uVar6 = ref_cell_add(local_f0->cell[6],(REF_INT *)&local_138,&local_fc);
                      if (uVar6 != 0) {
                        uVar18 = (ulong)uVar6;
                        pcVar12 = "qua";
                        uVar10 = 0x5f7;
                        goto LAB_0012785e;
                      }
                      uVar5 = uVar5 - 1;
                      uVar15 = uVar15 + 1;
                      uVar4 = uVar4 + 1;
                    } while (uVar5 != 0);
                  }
                  iVar17 = iVar17 + 1;
                  uVar3 = uVar3 + (int)local_d0;
                  local_e0 = local_e0 + (int)local_d0;
                } while (iVar17 != (int)local_118);
              }
              iVar17 = (int)local_118;
              uVar18 = local_d8;
              ref_node = local_e8;
              uVar19 = local_110;
            }
          }
        }
      }
      local_128 = 7;
      local_bc = 7;
      if ((int)uVar19 < 2) {
LAB_00127eb4:
        local_128 = 6;
        local_bc = 6;
      }
      else {
        uVar3 = 1;
        iVar17 = 1;
        pRVar13 = local_f0;
        local_110 = uVar19;
        local_e8 = ref_node;
        local_d8 = uVar18;
        do {
          local_a0 = (REF_DBL)CONCAT44(local_a0._4_4_,iVar17);
          local_f8 = (double)CONCAT44(local_f8._4_4_,uVar3);
          local_b0 = (REF_DBL)CONCAT44(local_b0._4_4_,(int)uVar7);
          uVar18 = local_68 & 0xffffffff;
          if (0 < (int)local_68) {
            do {
              local_108 = (double)CONCAT44(local_108._4_4_,(int)uVar18);
              local_138 = uVar3 - 1;
              uStack_12c = (uint)uVar7;
              uStack_130 = uStack_12c + 1;
              uVar7 = (ulong)uStack_130;
              local_134 = uVar3;
              local_c8 = local_138;
              uStack_c4 = uVar3;
              uStack_c0 = uStack_130;
              uVar4 = ref_cell_add(pRVar13->cell[3],(REF_INT *)&local_c8,&local_fc);
              if (uVar4 != 0) {
                uVar18 = (ulong)uVar4;
                pcVar12 = "tri";
                uVar10 = 0x607;
                goto LAB_0012785e;
              }
              local_c8 = local_138;
              uStack_c4 = uStack_130;
              uStack_c0 = uStack_12c;
              uVar4 = ref_cell_add(pRVar13->cell[3],(REF_INT *)&local_c8,&local_fc);
              uVar18 = (ulong)uVar4;
              if (uVar4 != 0) {
                pcVar12 = "tri";
                uVar10 = 0x60b;
                goto LAB_0012785e;
              }
              uVar3 = uVar3 + 1;
              uVar18 = (ulong)(local_108._0_4_ - 1);
              pRVar13 = local_f0;
            } while (local_108._0_4_ - 1 != 0);
          }
          iVar17 = local_a0._0_4_ + 1;
          uVar7 = (ulong)(local_b0._0_4_ + l);
          uVar3 = local_f8._0_4_ + l;
        } while (iVar17 != (int)local_110);
        local_128 = 5;
        local_bc = 5;
        iVar17 = (int)local_118;
        ref_node = local_e8;
        if ((int)local_110 < 2) goto LAB_00127eb4;
        iVar14 = (int)local_68 + 1;
        local_f8 = (double)CONCAT44(local_f8._4_4_,1);
        local_b0 = (REF_DBL)CONCAT44(local_b0._4_4_,iVar14);
        uVar7 = local_68;
        uVar19 = local_68;
        do {
          while (local_68 = uVar19, pRVar2 = local_f0, iVar14 < l) {
            local_108 = (double)CONCAT44(local_108._4_4_,iVar14);
            local_138 = (uint)uVar7;
            uVar4 = local_138 + 1;
            uStack_12c = l + local_138;
            uStack_130 = l + local_138 + 1;
            local_134 = uVar4;
            local_c8 = local_138;
            uStack_c4 = uVar4;
            uStack_c0 = uStack_130;
            uVar3 = ref_cell_add(pRVar13->cell[3],(REF_INT *)&local_c8,&local_fc);
            if (uVar3 != 0) {
              uVar18 = (ulong)uVar3;
              pcVar12 = "tri";
              uVar10 = 0x61b;
              goto LAB_0012785e;
            }
            local_c8 = local_138;
            uStack_c4 = uStack_130;
            uStack_c0 = uStack_12c;
            uVar3 = ref_cell_add(pRVar13->cell[3],(REF_INT *)&local_c8,&local_fc);
            uVar18 = (ulong)uVar3;
            uVar7 = (ulong)uVar4;
            iVar14 = local_108._0_4_ + 1;
            uVar19 = local_68;
            if (uVar3 != 0) {
              pcVar12 = "tri";
              uVar10 = 0x61f;
              goto LAB_0012785e;
            }
          }
          iVar8 = local_f8._0_4_ + 1;
          uVar7 = (ulong)(uint)((int)local_68 + l);
          local_f8 = (double)CONCAT44(local_f8._4_4_,iVar8);
          iVar14 = local_b0._0_4_;
          uVar19 = uVar7;
        } while (iVar8 != (int)local_110);
        local_128 = 6;
        local_bc = 6;
        ref_node = local_e8;
        if (1 < (int)local_110) {
          uVar3 = (int)local_d8 * (int)local_d0;
          local_d8 = (ulong)uVar3;
          local_108 = (double)CONCAT44(local_108._4_4_,l + uVar3);
          local_f8 = (double)CONCAT44(local_f8._4_4_,1);
          do {
            uVar7 = local_d8;
            uVar3 = local_108._0_4_;
            uVar4 = uVar16;
            if (1 < l) {
              do {
                local_134 = (uint)uVar7;
                local_138 = local_134 + 1;
                uVar7 = (ulong)local_138;
                uVar15 = uVar3 + 1;
                uStack_130 = uVar3;
                uStack_12c = uVar15;
                local_c8 = local_134;
                uStack_c4 = uVar15;
                uStack_c0 = local_138;
                uVar3 = ref_cell_add(pRVar2->cell[3],(REF_INT *)&local_c8,&local_fc);
                if (uVar3 != 0) {
                  uVar18 = (ulong)uVar3;
                  pcVar12 = "tri";
                  uVar10 = 0x62f;
                  goto LAB_0012785e;
                }
                local_c8 = local_134;
                uStack_c4 = uStack_130;
                uStack_c0 = uStack_12c;
                uVar3 = ref_cell_add(pRVar2->cell[3],(REF_INT *)&local_c8,&local_fc);
                if (uVar3 != 0) {
                  uVar18 = (ulong)uVar3;
                  pcVar12 = "tri";
                  uVar10 = 0x633;
                  goto LAB_0012785e;
                }
                uVar4 = uVar4 - 1;
                uVar3 = uVar15;
              } while (uVar4 != 0);
            }
            iVar14 = local_f8._0_4_ + 1;
            local_108 = (double)CONCAT44(local_108._4_4_,local_108._0_4_ + l);
            local_d8 = (ulong)(uint)((int)local_d8 + l);
            local_f8 = (double)CONCAT44(local_f8._4_4_,iVar14);
            iVar17 = (int)local_118;
            ref_node = local_e8;
          } while (iVar14 != (int)local_110);
        }
      }
      uVar3 = ref_node_initialize_n_global(ref_node,(long)((int)local_d0 * iVar17));
      if (uVar3 != 0) {
        uVar18 = (ulong)uVar3;
        pcVar12 = "init glob";
        uVar10 = 0x636;
        goto LAB_0012785e;
      }
    }
    else {
      uVar3 = ref_node_initialize_n_global(ref_node,(long)(m * l * iVar17));
      if (uVar3 != 0) {
        uVar18 = (ulong)uVar3;
        pcVar12 = "init glob";
        uVar10 = 0x59c;
        goto LAB_0012785e;
      }
    }
    RVar11 = 0;
  }
  else {
    uVar18 = (ulong)uVar3;
    pcVar12 = "create";
    uVar10 = 0x597;
LAB_0012785e:
    RVar11 = (REF_STATUS)uVar18;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
           uVar10,"ref_fixture_pri_brick_args_grid",uVar18,pcVar12);
  }
  return RVar11;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], pri[6], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        pri[0] = hex[0];
        pri[1] = hex[1];
        pri[2] = hex[2];
        pri[3] = hex[4];
        pri[4] = hex[5];
        pri[5] = hex[6];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
        pri[0] = hex[0];
        pri[1] = hex[2];
        pri[2] = hex[3];
        pri[3] = hex[4];
        pri[4] = hex[6];
        pri[5] = hex[7];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[1];
      tri[1] = quad[3];
      tri[2] = quad[0];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}